

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void duckdb::Executor::VerifyScheduledEventsInternal
               (idx_t vertex,vector<std::reference_wrapper<duckdb::Event>,_true> *vertices,
               vector<bool,_true> *visited,vector<bool,_true> *recursion_stack)

{
  pointer prVar1;
  pointer prVar2;
  Event *pEVar3;
  iterator iVar4;
  vector<bool,_true> *this;
  idx_t __n;
  vector<bool,_true> *visited_00;
  const_reference pvVar5;
  unsigned_long *i;
  idx_t *piVar6;
  const_iterator __begin1;
  pointer prVar7;
  reference rVar8;
  vector<unsigned_long,_true> adjacent;
  const_iterator __end1;
  unsigned_long local_70;
  idx_t *local_68;
  iterator iStack_60;
  unsigned_long *local_58;
  vector<bool,_true> *local_50;
  idx_t local_48;
  vector<bool,_true> *local_40;
  pointer local_38;
  
  local_40 = visited;
  rVar8 = vector<bool,_true>::get<true>(visited,vertex);
  if ((*rVar8._M_p & rVar8._M_mask) == 0) {
    pvVar5 = vector<std::reference_wrapper<duckdb::Event>,_true>::operator[](vertices,vertex);
    prVar7 = (pvVar5->_M_data->parents_raw).
             super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (pvVar5->_M_data->parents_raw).
               super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (prVar7 != local_38) {
      local_68 = (idx_t *)0x0;
      iStack_60._M_current = (idx_t *)0x0;
      local_58 = (unsigned_long *)0x0;
      prVar1 = (vertices->
               super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar2 = (vertices->
               super_vector<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ).
               super__Vector_base<std::reference_wrapper<duckdb::Event>,_std::allocator<std::reference_wrapper<duckdb::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = recursion_stack;
      local_48 = vertex;
      do {
        pEVar3 = prVar7->_M_data;
        local_70 = 0;
        if (prVar2 != prVar1) {
          do {
            pvVar5 = vector<std::reference_wrapper<duckdb::Event>,_true>::operator[]
                               (vertices,local_70);
            if (pvVar5->_M_data == pEVar3) {
              if (iStack_60._M_current == local_58) {
                ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                           iStack_60,&local_70);
              }
              else {
                *iStack_60._M_current = local_70;
                iStack_60._M_current = iStack_60._M_current + 1;
              }
              break;
            }
            local_70 = local_70 + 1;
          } while (local_70 < (ulong)((long)prVar2 - (long)prVar1 >> 3));
        }
        visited_00 = local_40;
        __n = local_48;
        prVar7 = prVar7 + 1;
      } while (prVar7 != local_38);
      rVar8 = vector<bool,_true>::get<true>(local_40,local_48);
      this = local_50;
      *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
      rVar8 = vector<bool,_true>::get<true>(local_50,__n);
      iVar4._M_current = iStack_60._M_current;
      *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
      for (piVar6 = local_68; piVar6 != iVar4._M_current; piVar6 = piVar6 + 1) {
        VerifyScheduledEventsInternal(*piVar6,vertices,visited_00,this);
      }
      rVar8 = vector<bool,_true>::get<true>(this,__n);
      *rVar8._M_p = *rVar8._M_p & ~rVar8._M_mask;
      if (local_68 != (idx_t *)0x0) {
        operator_delete(local_68);
      }
    }
  }
  return;
}

Assistant:

void Executor::VerifyScheduledEventsInternal(const idx_t vertex, const vector<reference<Event>> &vertices,
                                             vector<bool> &visited, vector<bool> &recursion_stack) {
	D_ASSERT(!recursion_stack[vertex]); // this vertex is in the recursion stack: circular dependency!
	if (visited[vertex]) {
		return; // early out: we already visited this vertex
	}

	auto &parents = vertices[vertex].get().GetParentsVerification();
	if (parents.empty()) {
		return; // early out: outgoing edges
	}

	// create a vector the indices of the adjacent events
	vector<idx_t> adjacent;
	const idx_t count = vertices.size();
	for (auto parent : parents) {
		idx_t i;
		for (i = 0; i < count; i++) {
			if (RefersToSameObject(vertices[i], parent)) {
				adjacent.push_back(i);
				break;
			}
		}
		D_ASSERT(i != count); // dependency must be in there somewhere
	}

	// mark vertex as visited and add to recursion stack
	visited[vertex] = true;
	recursion_stack[vertex] = true;

	// recurse into adjacent vertices
	for (const auto &i : adjacent) {
		VerifyScheduledEventsInternal(i, vertices, visited, recursion_stack);
	}

	// remove vertex from recursion stack
	recursion_stack[vertex] = false;
}